

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O3

string * amrex::anon_unknown_9::run_command(string *__return_storage_ptr__,string *cmd)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  undefined4 extraout_var;
  char print_buff [512];
  char acStack_228 [520];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __stream = popen((char *)cmd,"r");
  if (__stream != (FILE *)0x0) {
    while (pcVar2 = fgets(acStack_228,0x200,__stream), pcVar2 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    iVar1 = pclose(__stream);
    __stream = (FILE *)CONCAT44(extraout_var,iVar1);
  }
  return (string *)__stream;
}

Assistant:

std::string run_command (std::string const& cmd)
    {
        std::string r;
        if (FILE * ps = popen(cmd.c_str(), "r")) {
            char print_buff[512];
            while (fgets(print_buff, sizeof(print_buff), ps)) {
                r += print_buff;
            }
            pclose(ps);
        }
        return r;
    }